

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ReflectionClassGenerator *in_RSI;
  int i_4;
  int i_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enums;
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneofs;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  value_type *in_stack_fffffffffffffd78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffda8;
  EnumDescriptor *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Printer *in_stack_fffffffffffffdd0;
  OneofDescriptor *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  int local_1d4;
  string local_1d0 [32];
  string local_1b0 [24];
  FieldDescriptor *in_stack_fffffffffffffe68;
  int local_18c;
  string local_170 [32];
  string local_150 [36];
  int local_12c;
  string local_110 [32];
  string local_f0 [36];
  int local_cc;
  string local_b0 [32];
  string local_90 [36];
  int local_6c;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  bVar1 = in_CL & 1;
  bVar2 = IsMapEntryMessage((Descriptor *)0x4537f7);
  if (bVar2) {
    io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  }
  else {
    GetClassName_abi_cxx11_
              ((Descriptor *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    io::Printer::Print<char[10],std::__cxx11::string>
              ((Printer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (char *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->variable_delimiter_,
               in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string(local_40);
    iVar3 = Descriptor::field_count((Descriptor *)in_RSI);
    if (iVar3 < 1) {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x453898);
      Descriptor::field_count((Descriptor *)in_RSI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      for (local_6c = 0; iVar3 = local_6c, iVar4 = Descriptor::field_count((Descriptor *)in_RSI),
          iVar3 < iVar4; local_6c = local_6c + 1) {
        Descriptor::field((Descriptor *)in_RSI,local_6c);
        GetPropertyName_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffffdd8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__cxx11::string::~string(local_90);
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (char *)in_stack_fffffffffffffdb0);
      io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->variable_delimiter_,
                 in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd90);
    }
    iVar3 = Descriptor::oneof_decl_count((Descriptor *)in_RSI);
    if (iVar3 < 1) {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x453ab3);
      Descriptor::oneof_decl_count((Descriptor *)in_RSI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_cc = 0;
      in_stack_fffffffffffffdc8 = in_RDX;
      while (in_stack_fffffffffffffde4 = local_cc,
            iVar3 = Descriptor::oneof_decl_count((Descriptor *)in_RSI),
            in_stack_fffffffffffffde4 < iVar3) {
        in_stack_fffffffffffffdd8 = Descriptor::oneof_decl((Descriptor *)in_RSI,local_cc);
        in_stack_fffffffffffffdd0 =
             (Printer *)OneofDescriptor::name_abi_cxx11_(in_stack_fffffffffffffdd8);
        UnderscoresToCamelCase
                  ((string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__cxx11::string::~string(local_f0);
        local_cc = local_cc + 1;
      }
      in_RDX = in_stack_fffffffffffffdc8;
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (char *)in_stack_fffffffffffffdb0);
      io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->variable_delimiter_,
                 in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_110);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd90);
    }
    iVar3 = Descriptor::enum_type_count((Descriptor *)in_RSI);
    if (iVar3 < 1) {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x453ca6);
      Descriptor::enum_type_count((Descriptor *)in_RSI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_12c = 0;
      while (in_stack_fffffffffffffdbc = local_12c,
            iVar3 = Descriptor::enum_type_count((Descriptor *)in_RSI),
            in_stack_fffffffffffffdbc < iVar3) {
        in_stack_fffffffffffffdb0 = Descriptor::enum_type((Descriptor *)in_RSI,local_12c);
        GetClassName_abi_cxx11_
                  ((EnumDescriptor *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__cxx11::string::~string(local_150);
        local_12c = local_12c + 1;
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (char *)in_stack_fffffffffffffdb0);
      io::Printer::Print<char[6],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->variable_delimiter_,
                 in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd90);
    }
    iVar3 = Descriptor::extension_count((Descriptor *)in_RSI);
    if (iVar3 < 1) {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x453e83);
      for (local_18c = 0; iVar3 = Descriptor::extension_count((Descriptor *)in_RSI),
          local_18c < iVar3; local_18c = local_18c + 1) {
        Descriptor::extension((Descriptor *)in_RSI,local_18c);
        GetFullExtensionName_abi_cxx11_(in_stack_fffffffffffffe68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        std::__cxx11::string::~string(local_1b0);
      }
      pbVar5 = in_RDX;
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                 (char *)in_stack_fffffffffffffdb0);
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->variable_delimiter_,
                 in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDX);
      in_RDX = pbVar5;
    }
    iVar3 = Descriptor::nested_type_count((Descriptor *)in_RSI);
    if (iVar3 < 1) {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    else {
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      local_1d4 = 0;
      while (iVar3 = local_1d4, iVar4 = Descriptor::nested_type_count((Descriptor *)in_RSI),
            iVar3 < iVar4) {
        Descriptor::nested_type((Descriptor *)in_RSI,local_1d4);
        Descriptor::nested_type_count((Descriptor *)in_RSI);
        WriteGeneratedCodeInfo
                  (in_RSI,(Descriptor *)in_RDX,(Printer *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        local_1d4 = local_1d4 + 1;
      }
      io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    }
    io::Printer::Print<>(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));

  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      fields.reserve(descriptor->field_count());
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", Join(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      oneofs.reserve(descriptor->oneof_decl_count());
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", Join(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      enums.reserve(descriptor->enum_type_count());
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", Join(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Extensions
  if (descriptor->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < descriptor->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(descriptor->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null.
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}